

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * Curl_hash_pick(curl_hash *h,void *key,size_t key_len)

{
  curl_llist *pcVar1;
  curl_llist_element *pcVar2;
  void *pvVar3;
  size_t sVar4;
  
  if (h != (curl_hash *)0x0) {
    pcVar1 = h->table;
    sVar4 = (*h->hash_func)(key,key_len,(long)h->slots);
    for (pcVar2 = pcVar1[sVar4].head; pcVar2 != (curl_llist_element *)0x0; pcVar2 = pcVar2->next) {
      pvVar3 = pcVar2->ptr;
      sVar4 = (*h->comp_func)((void *)((long)pvVar3 + 0x28),*(size_t *)((long)pvVar3 + 0x20),key,
                              key_len);
      if (sVar4 != 0) {
        return *(void **)((long)pvVar3 + 0x18);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_llist *l;

  if(h) {
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}